

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::
str<char_const*&,char_const(&)[2],int&,char_const(&)[3],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String>
          (String *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],int *params_2,
          char (*params_3) [3],int *params_4,char (*params_5) [3],LogSeverity *params_6,
          char (*params_7) [3],String *params_8)

{
  char *pcVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff28;
  StringPtr local_d0;
  ArrayPtr<const_char> local_c0;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  ArrayPtr<const_char> local_90;
  char *local_80;
  size_t local_78;
  ArrayPtr<const_char> local_70;
  CappedArray<char,_14UL> local_60;
  CappedArray<char,_14UL> local_48;
  
  pcVar1 = *(char **)this;
  local_78 = strlen(pcVar1);
  local_80 = pcVar1;
  local_90.size_ = strlen((char *)params);
  local_90.ptr = (char *)params;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(int *)params_1);
  local_a0._8_8_ = strlen((char *)params_2);
  local_a0._0_8_ = params_2;
  _::Stringifier::operator*(&local_60,(Stringifier *)&_::STR,*(int *)params_3);
  local_b0._8_8_ = strlen((char *)params_4);
  local_b0._0_8_ = params_4;
  local_c0 = (ArrayPtr<const_char>)operator*(*(undefined4 *)params_5);
  local_d0.content.size_ = strlen((char *)params_6);
  local_d0.content.ptr = (char *)params_6;
  pcVar1 = *(char **)(params_7[2] + 2);
  local_70.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_70.ptr = *(char **)params_7;
  }
  local_70.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_70.size_ = (size_t)(pcVar1 + -1);
  }
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_80,&local_90,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)local_a0,(ArrayPtr<const_char> *)&local_60,
             (CappedArray<char,_14UL> *)local_b0,&local_c0,&local_d0,&local_70,
             in_stack_ffffffffffffff28);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}